

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageFieldGenerator::GenerateParsingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Type TVar1;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$type$.Builder subBuilder = null;\nif ($get_has_field_bit_message$) {\n  subBuilder = $name$_.toBuilder();\n}\n"
                    );
  TVar1 = GetType(this->descriptor_);
  text = "$name$_ = input.readMessage($type$.PARSER, extensionRegistry);\n";
  if (TVar1 == TYPE_GROUP) {
    text = "$name$_ = input.readGroup($number$, $type$.PARSER,\n    extensionRegistry);\n";
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,
                     "if (subBuilder != null) {\n  subBuilder.mergeFrom($name$_);\n  $name$_ = subBuilder.buildPartial();\n}\n"
                    );
  io::Printer::Print(printer,variables,"$set_has_field_bit_message$;\n");
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "$type$.Builder subBuilder = null;\n"
    "if ($get_has_field_bit_message$) {\n"
    "  subBuilder = $name$_.toBuilder();\n"
    "}\n");

  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
      "$name$_ = input.readGroup($number$, $type$.PARSER,\n"
      "    extensionRegistry);\n");
  } else {
    printer->Print(variables_,
      "$name$_ = input.readMessage($type$.PARSER, extensionRegistry);\n");
  }

  printer->Print(variables_,
    "if (subBuilder != null) {\n"
    "  subBuilder.mergeFrom($name$_);\n"
    "  $name$_ = subBuilder.buildPartial();\n"
    "}\n");
  printer->Print(variables_,
    "$set_has_field_bit_message$;\n");
}